

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.h
# Opt level: O0

bool endsWith(string *str,string *prefix)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *__s2;
  size_t __n;
  string *prefix_local;
  string *str_local;
  
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    str_local._7_1_ = false;
  }
  else {
    lVar4 = std::__cxx11::string::data();
    lVar5 = std::__cxx11::string::size();
    lVar6 = std::__cxx11::string::size();
    __s2 = (char *)std::__cxx11::string::data();
    __n = std::__cxx11::string::size();
    iVar1 = strncmp((char *)((lVar4 + lVar5) - lVar6),__s2,__n);
    str_local._7_1_ = iVar1 == 0;
  }
  return str_local._7_1_;
}

Assistant:

inline bool endsWith(const std::string& str, const std::string& prefix) {
  if (str.size() < prefix.size())
    return false;

  return strncmp(str.data() + str.size() - prefix.size(),
                 prefix.data(),
                 prefix.size()) == 0;
}